

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O0

void __thiscall
draco::PlyProperty::PlyProperty
          (PlyProperty *this,string *name,DataType data_type,DataType list_type)

{
  int32_t iVar1;
  DataType in_ECX;
  DataType in_EDX;
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x142d95);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x142da8);
  *(DataType *)(in_RDI + 0x50) = in_EDX;
  *(DataType *)(in_RDI + 0x58) = in_ECX;
  iVar1 = DataTypeLength(in_EDX);
  *(int32_t *)(in_RDI + 0x54) = iVar1;
  iVar1 = DataTypeLength(in_ECX);
  *(int32_t *)(in_RDI + 0x5c) = iVar1;
  return;
}

Assistant:

PlyProperty::PlyProperty(const std::string &name, DataType data_type,
                         DataType list_type)
    : name_(name), data_type_(data_type), list_data_type_(list_type) {
  data_type_num_bytes_ = DataTypeLength(data_type);
  list_data_type_num_bytes_ = DataTypeLength(list_type);
}